

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String&,char_const(&)[9],kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [9],
          String *params_2,String *params_3)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  long local_40;
  char *local_38;
  ArrayPtr<const_char> local_30;
  
  lVar1 = *(long *)(this + 8);
  local_40 = lVar1;
  if (lVar1 != 0) {
    local_40 = *(long *)this;
  }
  pcVar3 = (char *)0x0;
  local_38 = (char *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_38 = pcVar3;
  }
  local_50 = toCharSequence<char_const(&)[9]>((char (*) [9])params);
  pcVar2 = *(char **)(*params_1 + 8);
  local_60.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_60.ptr = *(char **)*params_1;
  }
  local_60.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_60.size_ = (size_t)pcVar3;
  }
  pcVar2 = (char *)(params_2->content).size_;
  local_30.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_30.ptr = (params_2->content).ptr;
  }
  local_30.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_30.size_ = (size_t)pcVar3;
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_30,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}